

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MAW.cpp
# Opt level: O3

void __thiscall
OpenMD::MAW::addExplicitInteraction
          (MAW *this,AtomType *atype1,AtomType *atype2,RealType De,RealType beta,RealType Re,
          RealType ca1,RealType cb1)

{
  vector<std::vector<OpenMD::MAWInteractionData,_std::allocator<OpenMD::MAWInteractionData>_>,_std::allocator<std::vector<OpenMD::MAWInteractionData,_std::allocator<OpenMD::MAWInteractionData>_>_>_>
  *this_00;
  long lVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  size_type __new_size;
  long lVar7;
  
  bVar2 = AtomType::isMetal(atype2);
  iVar3 = AtomType::getIdent(atype1);
  iVar3 = (this->MAWtids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[iVar3];
  lVar7 = (long)iVar3;
  iVar4 = AtomType::getIdent(atype2);
  iVar4 = (this->MAWtids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[iVar4];
  lVar6 = (long)iVar4;
  __new_size = (size_type)(int)(this->MAWtypes)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  this_00 = &this->MixingMap;
  std::
  vector<std::vector<OpenMD::MAWInteractionData,_std::allocator<OpenMD::MAWInteractionData>_>,_std::allocator<std::vector<OpenMD::MAWInteractionData,_std::allocator<OpenMD::MAWInteractionData>_>_>_>
  ::resize(this_00,__new_size);
  std::vector<OpenMD::MAWInteractionData,_std::allocator<OpenMD::MAWInteractionData>_>::resize
            ((this->MixingMap).
             super__Vector_base<std::vector<OpenMD::MAWInteractionData,_std::allocator<OpenMD::MAWInteractionData>_>,_std::allocator<std::vector<OpenMD::MAWInteractionData,_std::allocator<OpenMD::MAWInteractionData>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + lVar7,__new_size);
  lVar1 = *(long *)&(this->MixingMap).
                    super__Vector_base<std::vector<OpenMD::MAWInteractionData,_std::allocator<OpenMD::MAWInteractionData>_>,_std::allocator<std::vector<OpenMD::MAWInteractionData,_std::allocator<OpenMD::MAWInteractionData>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[lVar7].
                    super__Vector_base<OpenMD::MAWInteractionData,_std::allocator<OpenMD::MAWInteractionData>_>
                    ._M_impl.super__Vector_impl_data;
  lVar5 = lVar6 * 0x30;
  *(RealType *)(lVar1 + lVar5) = De;
  *(RealType *)(lVar1 + 8 + lVar5) = Re;
  *(RealType *)(lVar1 + 0x10 + lVar5) = beta;
  *(RealType *)(lVar1 + 0x18 + lVar5) = ca1;
  *(RealType *)(lVar1 + 0x20 + lVar5) = cb1;
  *(bool *)(lVar1 + 0x29 + lVar5) = bVar2;
  if (iVar4 != iVar3) {
    std::vector<OpenMD::MAWInteractionData,_std::allocator<OpenMD::MAWInteractionData>_>::resize
              ((this_00->
               super__Vector_base<std::vector<OpenMD::MAWInteractionData,_std::allocator<OpenMD::MAWInteractionData>_>,_std::allocator<std::vector<OpenMD::MAWInteractionData,_std::allocator<OpenMD::MAWInteractionData>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start + lVar6,__new_size);
    bVar2 = AtomType::isMetal(atype1);
    lVar1 = *(long *)&(this_00->
                      super__Vector_base<std::vector<OpenMD::MAWInteractionData,_std::allocator<OpenMD::MAWInteractionData>_>,_std::allocator<std::vector<OpenMD::MAWInteractionData,_std::allocator<OpenMD::MAWInteractionData>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start[lVar6].
                      super__Vector_base<OpenMD::MAWInteractionData,_std::allocator<OpenMD::MAWInteractionData>_>
                      ._M_impl.super__Vector_impl_data;
    lVar7 = lVar7 * 0x30;
    *(RealType *)(lVar1 + lVar7) = De;
    *(RealType *)(lVar1 + 8 + lVar7) = Re;
    *(RealType *)(lVar1 + 0x10 + lVar7) = beta;
    *(RealType *)(lVar1 + 0x18 + lVar7) = ca1;
    *(RealType *)(lVar1 + 0x20 + lVar7) = cb1;
    *(bool *)(lVar1 + 0x29 + lVar7) = bVar2;
  }
  return;
}

Assistant:

void MAW::addExplicitInteraction(AtomType* atype1, AtomType* atype2,
                                   RealType De, RealType beta, RealType Re,
                                   RealType ca1, RealType cb1) {
    MAWInteractionData mixer;
    mixer.De         = De;
    mixer.beta       = beta;
    mixer.Re         = Re;
    mixer.ca1        = ca1;
    mixer.cb1        = cb1;
    mixer.j_is_Metal = atype2->isMetal();

    int mtid1 = MAWtids[atype1->getIdent()];
    int mtid2 = MAWtids[atype2->getIdent()];
    int nM    = MAWtypes.size();

    MixingMap.resize(nM);
    MixingMap[mtid1].resize(nM);

    MixingMap[mtid1][mtid2] = mixer;
    if (mtid2 != mtid1) {
      MixingMap[mtid2].resize(nM);
      mixer.j_is_Metal        = atype1->isMetal();
      MixingMap[mtid2][mtid1] = mixer;
    }
  }